

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

int __thiscall
UnifiedRegex::SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
          (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this,DebugWriter *w,
          Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  char16 *litbuf_00;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_0145949d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x451);
  }
  DebugWriter::Print(w,
                     L"SyncToLiteralAndBackupInstT<EquivTrivialLastPatCharScannerMixin> aka SyncToLiteralEquivTrivialLastPatCharAndBackup"
                    );
  DebugWriter::Print(w,L"(");
  EquivScannerMixinT<1U>::Print(&this->super_EquivScannerMixinT<1U>,w,litbuf);
  DebugWriter::Print(w,L", ");
  BackupMixin::Print(&this->super_BackupMixin,w,litbuf_00);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_0145949d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::EquivScannerMixinT<1u>>
              (&this->super_Inst,w,&this->super_Inst,&this->super_EquivScannerMixinT<1U>,
               L"EquivTrivialLastPatCharScannerMixin");
    Inst::PrintBytes<UnifiedRegex::BackupMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_BackupMixin,L"BackupMixin");
    DebugWriter::Unindent(w);
  }
  return 0x451;
}

Assistant:

int SyncToLiteralAndBackupInstT<EquivTrivialLastPatCharScannerMixin>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        // NOTE: this text is unique to this instantiation
        PRINT_RE_BYTECODE_BEGIN("SyncToLiteralAndBackupInstT<EquivTrivialLastPatCharScannerMixin> aka SyncToLiteralEquivTrivialLastPatCharAndBackup");
        PRINT_MIXIN_COMMA(EquivTrivialLastPatCharScannerMixin); // NOTE: would work with template <typename ScannerT> ScannerT::Print
        PRINT_MIXIN(BackupMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(EquivTrivialLastPatCharScannerMixin); // NOTE: unique because macro expansion and _u(#InstType) happen before template is evaluated (so text would be ScannerT)
        PRINT_BYTES(BackupMixin);
        PRINT_RE_BYTECODE_END();
    }